

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O0

void soplex::SPxEquiliSC<double>::computePostequiExpVecs
               (SPxLPBase<double> *lp,vector<double,_std::allocator<double>_> *preRowscale,
               vector<double,_std::allocator<double>_> *preColscale,DataArray<int> *rowscaleExp,
               DataArray<int> *colscaleExp,double epsilon)

{
  LPRowSetBase<double> *in_RDI;
  double dVar1;
  double dVar2;
  bool colFirst;
  DataArray<int> *unaff_retaddr;
  double rowratio;
  double colratio;
  bool in_stack_00000067;
  vector<double,_std::allocator<double>_> *in_stack_00000068;
  SPxLPBase<double> *in_stack_00000070;
  
  dVar1 = maxPrescaledRatio<double>(in_stack_00000070,in_stack_00000068,in_stack_00000067);
  dVar2 = maxPrescaledRatio<double>(in_stack_00000070,in_stack_00000068,in_stack_00000067);
  if (dVar2 <= dVar1) {
    LPRowSetBase<double>::rowSet(in_RDI);
    computeEquiExpVec((SVSetBase<double> *)colratio,
                      (vector<double,_std::allocator<double>_> *)rowratio,unaff_retaddr,
                      (double)in_RDI);
    LPColSetBase<double>::colSet((LPColSetBase<double> *)(in_RDI + 1));
    computeEquiExpVec((SVSetBase<double> *)colratio,(DataArray<int> *)rowratio,unaff_retaddr,
                      (double)in_RDI);
  }
  else {
    LPColSetBase<double>::colSet((LPColSetBase<double> *)(in_RDI + 1));
    computeEquiExpVec((SVSetBase<double> *)colratio,
                      (vector<double,_std::allocator<double>_> *)rowratio,unaff_retaddr,
                      (double)in_RDI);
    LPRowSetBase<double>::rowSet(in_RDI);
    computeEquiExpVec((SVSetBase<double> *)colratio,(DataArray<int> *)rowratio,unaff_retaddr,
                      (double)in_RDI);
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computePostequiExpVecs(const SPxLPBase<R>& lp,
      const std::vector<R>& preRowscale, const std::vector<R>& preColscale,
      DataArray<int>& rowscaleExp, DataArray<int>& colscaleExp, R epsilon)
{
   const R colratio = maxPrescaledRatio(lp, preRowscale, false);
   const R rowratio = maxPrescaledRatio(lp, preColscale, true);

   const bool colFirst = colratio < rowratio;

   // see SPxEquiliSC<R>::scale for reason behind this branch
   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), preRowscale, colscaleExp, epsilon);
      computeEquiExpVec(lp.rowSet(), colscaleExp, rowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), preColscale, rowscaleExp, epsilon);
      computeEquiExpVec(lp.colSet(), rowscaleExp, colscaleExp, epsilon);
   }
}